

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateCheckFixedFld(Lowerer *this,Instr *instrChkFld)

{
  uint uVar1;
  code *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Opnd *pOVar9;
  SymOpnd *this_00;
  undefined4 *puVar10;
  PropertySymOpnd *this_01;
  PropertySym *pPVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *this_03;
  char16 *pcVar14;
  char16_t *pcVar15;
  BVSparse<Memory::JitArenaAllocator> *pBVar16;
  LabelInstr *branchTarget;
  BranchInstr *instr_00;
  BailOutInfo *pBVar17;
  BVIndex local_4ac;
  bool local_46a;
  bool local_469;
  WCHAR local_458 [4];
  WCHAR prefixValue [512];
  bool checkFixedTypeGenerated;
  bool checkFixedDataGenerated;
  uint inlineCacheIndex;
  PropertySym *propertySym;
  bool emitFixedFieldTypeCheck;
  bool emitPrimaryTypeCheck;
  PropertySymOpnd *propertySymOpnd;
  LabelInstr *labelDone;
  LabelInstr *labelBailOut;
  Instr *instr;
  Instr *instrChkFld_local;
  Lowerer *this_local;
  
  labelDone = (LabelInstr *)0x0;
  uVar6 = Func::GetSourceContextId(instrChkFld->m_func);
  uVar7 = Func::GetLocalFunctionId(instrChkFld->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar6,uVar7);
  if (bVar4) {
    uVar6 = Func::GetSourceContextId(instrChkFld->m_func);
    uVar7 = Func::GetLocalFunctionId(instrChkFld->m_func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,UseFixedDataPropsPhase,uVar6,uVar7);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1894,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())))"
                         ,"Lowering a check fixed field with fixed data/method phase disabled?");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  pOVar9 = IR::Instr::GetSrc1(instrChkFld);
  bVar4 = IR::Opnd::IsSymOpnd(pOVar9);
  if (bVar4) {
    pOVar9 = IR::Instr::GetSrc1(instrChkFld);
    this_00 = IR::Opnd::AsSymOpnd(pOVar9);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar4) goto LAB_0078acdb;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar10 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1896,
                     "(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                     ,
                     "instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                    );
  if (!bVar4) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar10 = 0;
LAB_0078acdb:
  pOVar9 = IR::Instr::GetSrc1(instrChkFld);
  this_01 = IR::Opnd::AsPropertySymOpnd(pOVar9);
  bVar4 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1899,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar4 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189a,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar4 = IR::PropertySymOpnd::IsTypeCheckProtected(this_01);
  if ((bVar4) &&
     (pBVar16 = IR::PropertySymOpnd::GetGuardedPropOps(this_01),
     pBVar16 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189e,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar4 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar5 = IR::PropertySymOpnd::NeedsCheckFixedFieldTypeCheck(this_01);
  local_469 = false;
  if (bVar5) {
    bVar5 = IR::PropertySymOpnd::IsTypeChecked(this_01);
    local_46a = true;
    if (bVar5) {
      local_46a = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
    }
    local_469 = local_46a;
  }
  pPVar11 = Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
  prefixValue._1020_4_ = this_01->m_inlineCacheIndex;
  prefixValue[0x1fd]._1_1_ = 0;
  prefixValue[0x1fd]._0_1_ = 0;
  uVar6 = Func::GetSourceContextId(this->m_func);
  uVar7 = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar6,uVar7);
  if (bVar5) {
    pJVar12 = Func::GetJITFunctionBody(this->m_func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pJVar12 = Func::GetJITFunctionBody(this->m_func);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    this_02 = Func::GetWorkItem(this->m_func);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this_02);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    pJVar12 = Func::GetJITFunctionBody(this->m_func);
    uVar8 = JITTimeFunctionBody::GetFunctionNumber(pJVar12);
    swprintf_s<512ul>((WCHAR (*) [512])local_458,L"%s (#%d.%u, #%u)",pcVar13,(ulong)uVar6,
                      (ulong)uVar7,(ulong)uVar8);
    pcVar13 = Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode);
    uVar3 = prefixValue._1020_4_;
    uVar1 = pPVar11->m_propertyId;
    pcVar14 = IR::PropertySymOpnd::GetCacheLayoutString(this_01);
    bVar5 = IR::PropertySymOpnd::IsTypeChecked(this_01);
    pcVar15 = L"false";
    if (bVar5) {
      pcVar15 = L"true";
    }
    pBVar16 = IR::PropertySymOpnd::GetGuardedPropOps(this_01);
    if (pBVar16 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      local_4ac = 0;
    }
    else {
      pBVar16 = IR::PropertySymOpnd::GetGuardedPropOps(this_01);
      local_4ac = BVSparse<Memory::JitArenaAllocator>::Count(pBVar16);
    }
    Output::TraceWithPrefix
              (ObjTypeSpecPhase,local_458,
               L"Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"
               ,pcVar13,(ulong)uVar1,(ulong)(uint)uVar3,pcVar14,pcVar15,local_4ac);
  }
  if ((bVar4) || (local_469 != false)) {
    labelDone = IR::LabelInstr::New(Label,this->m_func,true);
    if ((local_469 == false) ||
       (bVar5 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01), !bVar5)) {
      if (local_469 != false) {
        IR::PropertySymOpnd::EnsureGuardedPropOps(this_01,this->m_func->m_alloc);
        uVar6 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
        IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar6);
      }
      GenerateCachedTypeCheck(this,instrChkFld,this_01,labelDone,labelDone,(LabelInstr *)0x0);
      prefixValue[0x1fd]._0_1_ = 1;
    }
    else {
      pBVar16 = IR::PropertySymOpnd::GetGuardedPropOps(this_01);
      if (pBVar16 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pBVar16 = IR::PropertySymOpnd::GetGuardedPropOps(this_01);
        bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar16);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x18bf,
                             "(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty())"
                             ,"This property Guard is used only for one property");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
      }
      prefixValue[0x1fd]._1_1_ = GenerateFixedFieldGuardCheck(this,instrChkFld,this_01,labelDone);
    }
  }
  if (((!bVar4) && (local_469 == false)) &&
     (bVar5 = IR::PropertySymOpnd::IsWriteGuardChecked(this_01), !bVar5)) {
    uVar6 = Func::GetSourceContextId(this->m_func);
    uVar7 = Func::GetLocalFunctionId(this->m_func);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedFieldGuardCheckPhase,uVar6,uVar7);
    if (!bVar5) {
      if (labelDone != (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x18d7,"(labelBailOut == nullptr)","labelBailOut == nullptr");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      labelDone = IR::LabelInstr::New(Label,this->m_func,true);
      prefixValue[0x1fd]._1_1_ = GenerateFixedFieldGuardCheck(this,instrChkFld,this_01,labelDone);
    }
  }
  if (((bVar4) || (local_469 != false)) ||
     (bVar4 = IR::PropertySymOpnd::IsWriteGuardChecked(this_01), !bVar4)) {
    if (((prefixValue[0x1fd]._1_1_ & 1) == 0) && (((byte)prefixValue[0x1fd] & 1) == 0)) {
      IR::Instr::Remove(instrChkFld);
    }
    else {
      branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
      instr_00 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instrChkFld,&instr_00->super_Instr);
      IR::Instr::InsertBefore(instrChkFld,&labelDone->super_Instr);
      IR::Instr::InsertAfter(instrChkFld,&branchTarget->super_Instr);
      bVar4 = IR::PropertySymOpnd::ProducesAuxSlotPtr(this_01);
      if (bVar4) {
        GenerateAuxSlotPtrLoad(this,this_01,(branchTarget->super_Instr).m_next);
      }
      bVar4 = IR::Instr::HasBailOutInfo(instrChkFld);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x190a,"(instrChkFld->HasBailOutInfo())","instrChkFld->HasBailOutInfo()"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      pBVar17 = IR::Instr::GetBailOutInfo(instrChkFld);
      uVar3 = prefixValue._1020_4_;
      if (pBVar17->bailOutInstr != instrChkFld) {
        pBVar17 = IR::Instr::GetBailOutInfo(instrChkFld);
        pBVar17->polymorphicCacheIndex = uVar3;
      }
      IR::Instr::FreeSrc1(instrChkFld);
      instrChkFld->m_opcode = BailOut;
      GenerateBailOut(this,instrChkFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
  }
  else {
    if (labelDone != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x18e7,"(labelBailOut == nullptr)","labelBailOut == nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar4 = IR::Instr::HasBailOutInfo(instrChkFld);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x18e8,"(!instrChkFld->HasBailOutInfo())",
                         "Why does a direct fixed field check have bailout?");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar4 = IR::PropertySymOpnd::ProducesAuxSlotPtr(this_01);
    if (bVar4) {
      GenerateAuxSlotPtrLoad(this,this_01,instrChkFld);
    }
    IR::Instr::Remove(instrChkFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateCheckFixedFld(IR::Instr * instrChkFld)
{
    IR::Instr *instr;
    IR::LabelInstr *labelBailOut = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instrChkFld->m_func) ||
        !PHASE_OFF(Js::UseFixedDataPropsPhase, instrChkFld->m_func), "Lowering a check fixed field with fixed data/method phase disabled?");

    Assert(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkFld->GetSrc1()->AsPropertySymOpnd();

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    // For the non-configurable properties on the global object we do not need a type check.  Otherwise,
    // we need a type check and bailout here unless this operation is part of the type check sequence and
    // is protected by a type check upstream.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    // In addition, we may also need a local type check in case the property comes from the prototype and
    // it may have been overwritten on the instance after the primary type check upstream. If the property
    // comes from the instance, we must still protect against its value changing after the type check, but
    // for this a cheaper guard check is sufficient (see below).
    bool emitFixedFieldTypeCheck = propertySymOpnd->NeedsCheckFixedFieldTypeCheck() &&
        (!propertySymOpnd->IsTypeChecked() || propertySymOpnd->IsLoadedFromProto());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;
    bool checkFixedDataGenerated = false;
    bool checkFixedTypeGenerated = false;

    OUTPUT_TRACE_FUNC(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode),
        propertySym->m_propertyId,
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"),
        propertySymOpnd->GetGuardedPropOps() ? propertySymOpnd->GetGuardedPropOps()->Count() : 0);

    if (emitPrimaryTypeCheck || emitFixedFieldTypeCheck)
    {
        labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if(emitFixedFieldTypeCheck && propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())
        {
            AssertMsg(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty(), "This property Guard is used only for one property");
            //We need only cheaper Guard check, if the property belongs to the GlobalObject.
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
        else
        {
            if (emitFixedFieldTypeCheck)
            {
                propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
                propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
            }
            this->GenerateCachedTypeCheck(instrChkFld, propertySymOpnd, labelBailOut, labelBailOut);
            checkFixedTypeGenerated = true;
        }
    }

    // We may still need this guard if we didn't emit the write protect type check above. This situation arises if we have
    // a fixed field from the instance (not proto) and a property of the same name has been written somewhere between the
    // primary type check and here. Note that we don't need a type check, because we know the fixed field exists on the
    // object even if it has been written since primary type check, but we need to verify the fixed value didn't get overwritten.
    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && !propertySymOpnd->IsWriteGuardChecked())
    {
        if (!PHASE_OFF(Js::FixedFieldGuardCheckPhase, this->m_func))
        {
            Assert(labelBailOut == nullptr);
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
    }

    // Note that a type handler holds only a weak reference to the singleton instance it represents, so
    // it is possible that the instance gets collected before the type and handler do. Hence, the upstream
    // type check may succeed, even as the original instance no longer exists. However, this would happen
    // only if another instance reached the same type (otherwise we wouldn't ever pass the type check
    // upstream). In that case we would have invalidated all fixed fields on that type, and so the type
    // check (or property guard check, if necessary) above would fail. All in all, we would never attempt
    // to access a fixed field from an instance that has been collected.

    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && propertySymOpnd->IsWriteGuardChecked())
    {
        Assert(labelBailOut == nullptr);
        AssertMsg(!instrChkFld->HasBailOutInfo(), "Why does a direct fixed field check have bailout?");
        if (propertySymOpnd->ProducesAuxSlotPtr())
        {
            this->GenerateAuxSlotPtrLoad(propertySymOpnd, instrChkFld);
        }
        instrChkFld->Remove();
        return true;
    }

    // With lazy bailout, no checks might be generated for CheckFixedFld, so the code in Lowerer is only an
    // unconditional jmp to get past the bailout helper block. This is a new case and is unexpected, so layout
    // phase will also move the statement boundary preceding CheckFixedFld together with the jmp to after
    // function exit. As a result, source mapping is incorrect. Make sure that this doesn't happen by not
    // generating helper blocks at all if we don't generate checks.
    if (!checkFixedDataGenerated && !checkFixedTypeGenerated)
    {
        instrChkFld->Remove();
        return true;
    }

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkFld->InsertBefore(instr);

    // Insert the helper label here.
    instrChkFld->InsertBefore(labelBailOut);
    instrChkFld->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkFld->HasBailOutInfo());

    if (instrChkFld->GetBailOutInfo()->bailOutInstr != instrChkFld)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkFld->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkFld->FreeSrc1();
    instrChkFld->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkFld);

    return true;
}